

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet.c
# Opt level: O0

int inet_pton6(char *src,uchar *dst)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  int local_84;
  int i;
  int n;
  int err;
  char *pch;
  int local_68;
  uint val;
  int seen_xdigits;
  int ch;
  char *curtok;
  char *xdigits;
  uchar *colonp;
  uchar *endp;
  uchar *tp;
  uchar tmp [16];
  uchar *dst_local;
  char *src_local;
  
  endp = (uchar *)&tp;
  memset(endp,0,0x10);
  puVar3 = tmp + 8;
  xdigits = (char *)0x0;
  dst_local = (uchar *)src;
  if ((*src != ':') || (dst_local = (uchar *)(src + 1), src[1] == ':')) {
    _seen_xdigits = dst_local;
    local_68 = 0;
    pch._4_4_ = 0;
LAB_0012f1b3:
    do {
      puVar4 = dst_local + 1;
      iVar2 = (int)(char)*dst_local;
      uVar1 = (uchar)(pch._4_4_ >> 8);
      if (iVar2 == 0) {
LAB_0012f361:
        if (local_68 != 0) {
          if (puVar3 < endp + 2) {
            return -0x16;
          }
          puVar4 = endp + 1;
          *endp = uVar1;
          endp = endp + 2;
          *puVar4 = (uchar)pch._4_4_;
        }
        if (xdigits != (char *)0x0) {
          iVar2 = (int)endp - (int)xdigits;
          if (endp == puVar3) {
            return -0x16;
          }
          for (local_84 = 1; endp = puVar3, local_84 <= iVar2; local_84 = local_84 + 1) {
            puVar3[-local_84] = xdigits[iVar2 - local_84];
            xdigits[iVar2 - local_84] = '\0';
          }
        }
        if (endp == puVar3) {
          *(uchar **)dst = tp;
          *(undefined8 *)(dst + 8) = tmp._0_8_;
          return 0;
        }
        return -0x16;
      }
      curtok._0_4_ = 0x135a60;
      _n = strchr("0123456789abcdef",iVar2);
      if (_n == (char *)0x0) {
        curtok._0_4_ = 0x135a80;
        _n = strchr("0123456789ABCDEF",iVar2);
      }
      dst_local = puVar4;
      if (_n == (char *)0x0) {
        if (iVar2 != 0x3a) {
          if (((iVar2 != 0x2e) || (puVar3 < endp + 4)) ||
             (iVar2 = inet_pton4((char *)_seen_xdigits,endp), iVar2 != 0)) {
            return -0x16;
          }
          endp = endp + 4;
          local_68 = 0;
          goto LAB_0012f361;
        }
        _seen_xdigits = puVar4;
        if (local_68 == 0) {
          if (xdigits != (char *)0x0) {
            return -0x16;
          }
          xdigits = (char *)endp;
        }
        else {
          if (*puVar4 == '\0') {
            return -0x16;
          }
          if (puVar3 < endp + 2) {
            return -0x16;
          }
          puVar4 = endp + 1;
          *endp = uVar1;
          endp = endp + 2;
          *puVar4 = (uchar)pch._4_4_;
          local_68 = 0;
          pch._4_4_ = 0;
        }
        goto LAB_0012f1b3;
      }
      pch._4_4_ = pch._4_4_ << 4 | (int)_n - (int)curtok;
      local_68 = local_68 + 1;
    } while (local_68 < 5);
  }
  return -0x16;
}

Assistant:

static int inet_pton6(const char *src, unsigned char *dst) {
  static const char xdigits_l[] = "0123456789abcdef",
                    xdigits_u[] = "0123456789ABCDEF";
  unsigned char tmp[sizeof(struct in6_addr)], *tp, *endp, *colonp;
  const char *xdigits, *curtok;
  int ch, seen_xdigits;
  unsigned int val;

  memset((tp = tmp), '\0', sizeof tmp);
  endp = tp + sizeof tmp;
  colonp = NULL;
  /* Leading :: requires some special handling. */
  if (*src == ':')
    if (*++src != ':')
      return UV_EINVAL;
  curtok = src;
  seen_xdigits = 0;
  val = 0;
  while ((ch = *src++) != '\0') {
    const char *pch;

    if ((pch = strchr((xdigits = xdigits_l), ch)) == NULL)
      pch = strchr((xdigits = xdigits_u), ch);
    if (pch != NULL) {
      val <<= 4;
      val |= (pch - xdigits);
      if (++seen_xdigits > 4)
        return UV_EINVAL;
      continue;
    }
    if (ch == ':') {
      curtok = src;
      if (!seen_xdigits) {
        if (colonp)
          return UV_EINVAL;
        colonp = tp;
        continue;
      } else if (*src == '\0') {
        return UV_EINVAL;
      }
      if (tp + sizeof(uint16_t) > endp)
        return UV_EINVAL;
      *tp++ = (unsigned char) (val >> 8) & 0xff;
      *tp++ = (unsigned char) val & 0xff;
      seen_xdigits = 0;
      val = 0;
      continue;
    }
    if (ch == '.' && ((tp + sizeof(struct in_addr)) <= endp)) {
      int err = inet_pton4(curtok, tp);
      if (err == 0) {
        tp += sizeof(struct in_addr);
        seen_xdigits = 0;
        break;  /*%< '\\0' was seen by inet_pton4(). */
      }
    }
    return UV_EINVAL;
  }
  if (seen_xdigits) {
    if (tp + sizeof(uint16_t) > endp)
      return UV_EINVAL;
    *tp++ = (unsigned char) (val >> 8) & 0xff;
    *tp++ = (unsigned char) val & 0xff;
  }
  if (colonp != NULL) {
    /*
     * Since some memmove()'s erroneously fail to handle
     * overlapping regions, we'll do the shift by hand.
     */
    const int n = tp - colonp;
    int i;

    if (tp == endp)
      return UV_EINVAL;
    for (i = 1; i <= n; i++) {
      endp[- i] = colonp[n - i];
      colonp[n - i] = 0;
    }
    tp = endp;
  }
  if (tp != endp)
    return UV_EINVAL;
  memcpy(dst, tmp, sizeof tmp);
  return 0;
}